

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O1

void N_VAddConst_Serial(N_Vector x,sunrealtype b,N_Vector z)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar1 = *x->content;
  if (0 < lVar1) {
    lVar2 = *(long *)((long)x->content + 0x10);
    lVar3 = *(long *)((long)z->content + 0x10);
    lVar4 = 0;
    do {
      *(double *)(lVar3 + lVar4 * 8) = *(double *)(lVar2 + lVar4 * 8) + b;
      lVar4 = lVar4 + 1;
    } while (lVar1 != lVar4);
  }
  return;
}

Assistant:

void N_VAddConst_Serial(N_Vector x, sunrealtype b, N_Vector z)
{
  sunindextype i, N;
  sunrealtype *xd, *zd;

  xd = zd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  zd = NV_DATA_S(z);

  for (i = 0; i < N; i++) { zd[i] = xd[i] + b; }

  return;
}